

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegExp.cc
# Opt level: O2

void __thiscall flow::util::RegExp::~RegExp(RegExp *this)

{
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&this->re_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

RegExp::~RegExp() {
}